

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_miniz.h
# Opt level: O0

void * buminiz::tdefl_compress_mem_to_heap
                 (void *pSrc_buf,size_t src_buf_len,size_t *pOut_len,int flags)

{
  mz_bool mVar1;
  undefined4 in_ECX;
  undefined8 *in_RDX;
  void *in_RSI;
  tdefl_output_buffer out_buf;
  undefined8 local_48 [2];
  undefined4 local_38;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  void *local_8;
  
  memset(local_48,0,0x20);
  if (in_RDX == (undefined8 *)0x0) {
    local_8 = (void *)0x0;
  }
  else {
    *in_RDX = 0;
    mVar1 = tdefl_compress_mem_to_output
                      (in_RSI,(size_t)in_RDX,
                       (tdefl_put_buf_func_ptr)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                       (void *)CONCAT44(in_stack_ffffffffffffffd4,1),in_stack_ffffffffffffffcc);
    if (mVar1 == 0) {
      local_8 = (void *)0x0;
    }
    else {
      *in_RDX = local_48[0];
      local_8 = (void *)CONCAT44(in_stack_ffffffffffffffcc,local_38);
    }
  }
  return local_8;
}

Assistant:

void *tdefl_compress_mem_to_heap(const void *pSrc_buf, size_t src_buf_len, size_t *pOut_len, int flags)
{
  tdefl_output_buffer out_buf; MZ_CLEAR_OBJ(out_buf);
  if (!pOut_len) return MZ_FALSE; else *pOut_len = 0;
  out_buf.m_expandable = MZ_TRUE;
  if (!tdefl_compress_mem_to_output(pSrc_buf, src_buf_len, tdefl_output_buffer_putter, &out_buf, flags)) return NULL;
  *pOut_len = out_buf.m_size; return out_buf.m_pBuf;
}